

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O1

char * apprun_string_list_join(char **string_list,char *split)

{
  char **ppcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong __nmemb;
  bool bVar9;
  
  if (string_list == (char **)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    ppcVar1 = string_list;
    do {
      uVar6 = uVar6 + 1;
      pcVar4 = *ppcVar1;
      ppcVar1 = ppcVar1 + 1;
    } while (pcVar4 != (char *)0x0);
  }
  sVar2 = strlen(split);
  __nmemb = 0;
  uVar7 = (ulong)uVar6;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      sVar3 = strlen(string_list[uVar5]);
      uVar8 = (int)__nmemb + (int)sVar2 + (int)sVar3;
      __nmemb = (ulong)uVar8;
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    __nmemb = (ulong)uVar8;
  }
  uVar5 = 1;
  pcVar4 = (char *)calloc(__nmemb,1);
  if (uVar6 != 0) {
    do {
      strcat(pcVar4,string_list[uVar5 - 1]);
      if (uVar5 < uVar7) {
        strcat(pcVar4,split);
      }
      bVar9 = uVar5 != uVar7;
      uVar5 = uVar5 + 1;
    } while (bVar9);
  }
  return pcVar4;
}

Assistant:

char *apprun_string_list_join(char *const *string_list, char *split) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned split_len = strlen(split);
    unsigned str_size = 0;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + split_len;

    char *str = calloc(str_size, sizeof(char));
    for (int i = 0; i < string_list_len; i++) {
        strcat(str, string_list[i]);
        if (i + 1 < string_list_len)
            strcat(str, split);
    }

    return str;
}